

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O2

MQTT_MESSAGE_HANDLE
mqttmessage_create_in_place
          (uint16_t packetId,char *topicName,QOS_VALUE qosValue,uint8_t *appMsg,size_t appMsgLength)

{
  int iVar1;
  MQTT_MESSAGE *pMVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  
  if (topicName == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (MQTT_MESSAGE_HANDLE)0x0;
    }
    pcVar4 = "Invalid Parameter topicName: %p, packetId: %d.";
    iVar1 = 0x34;
  }
  else {
    pMVar2 = create_msg_object(packetId,qosValue);
    if (pMVar2 != (MQTT_MESSAGE *)0x0) {
      pMVar2->const_topic_name = topicName;
      (pMVar2->const_payload).length = appMsgLength;
      if (appMsgLength != 0) {
        (pMVar2->const_payload).message = appMsg;
        return pMVar2;
      }
      return pMVar2;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (MQTT_MESSAGE_HANDLE)0x0;
    }
    pcVar4 = "Failure creating message object";
    iVar1 = 0x3d;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_message.c"
            ,"mqttmessage_create_in_place",iVar1,1,pcVar4);
  return (MQTT_MESSAGE_HANDLE)0x0;
}

Assistant:

MQTT_MESSAGE_HANDLE mqttmessage_create_in_place(uint16_t packetId, const char* topicName, QOS_VALUE qosValue, const uint8_t* appMsg, size_t appMsgLength)
{
    /* Codes_SRS_MQTTMESSAGE_07_026: [If the parameters topicName is NULL then mqttmessage_create_in_place shall return NULL.].] */
    MQTT_MESSAGE* result;
    if (topicName == NULL)
    {
        LogError("Invalid Parameter topicName: %p, packetId: %d.", topicName, packetId);
        result = NULL;
    }
    else
    {
        result = create_msg_object(packetId, qosValue);
        if (result == NULL)
        {
            /* Codes_SRS_MQTTMESSAGE_07_028: [If any memory allocation fails mqttmessage_create_in_place shall free any allocated memory and return NULL.] */
            LogError("Failure creating message object");
        }
        else
        {
            /* Codes_SRS_MQTTMESSAGE_07_027: [mqttmessage_create_in_place shall use the a pointer to topicName or appMsg .] */
            result->const_topic_name = topicName;
            result->const_payload.length = appMsgLength;
            if (result->const_payload.length > 0)
            {
                result->const_payload.message = (uint8_t*)appMsg;
            }
        }
    }
    /* Codes_SRS_MQTTMESSAGE_07_029: [ Upon success, mqttmessage_create_in_place shall return a NON-NULL MQTT_MESSAGE_HANDLE value.] */
    return (MQTT_MESSAGE_HANDLE)result;
}